

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

Instr * __thiscall
BackwardPass::ProcessPendingPreOpBailOutInfo(BackwardPass *this,Instr *currentInstr)

{
  uint32 uVar1;
  Instr *pIVar2;
  code *pcVar3;
  bool bVar4;
  uint32 uVar5;
  undefined4 *puVar6;
  BailOutInfo *bailOutInfo_00;
  bool local_41;
  BailOutInfo *bailOutInfo;
  Instr *instr;
  Instr *prev;
  Instr *currentInstr_local;
  BackwardPass *this_local;
  
  bVar4 = IsCollectionPass(this);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0xa18,"(!IsCollectionPass())","!IsCollectionPass()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (this->preOpBailOutInstrToProcess == (Instr *)0x0) {
    this_local = (BackwardPass *)currentInstr->m_prev;
  }
  else {
    if (this->preOpBailOutInstrToProcess != currentInstr) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0xa1e,"(preOpBailOutInstrToProcess == currentInstr)",
                         "preOpBailOutInstrToProcess == currentInstr");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    bVar4 = IsPrePass(this);
    if (!bVar4) {
      pIVar2 = this->preOpBailOutInstrToProcess->m_prev;
      while( true ) {
        instr = pIVar2;
        local_41 = false;
        if (instr != (Instr *)0x0) {
          local_41 = IR::Instr::CanAggregateByteCodeUsesAcrossInstr
                               (this->preOpBailOutInstrToProcess,instr);
        }
        if (local_41 == false) break;
        pIVar2 = instr->m_prev;
        bVar4 = IR::Instr::IsByteCodeUsesInstrFor(instr,this->preOpBailOutInstrToProcess);
        if (bVar4) {
          ProcessByteCodeUsesInstr(this,instr);
        }
      }
    }
    bailOutInfo_00 = IR::Instr::GetBailOutInfo(this->preOpBailOutInstrToProcess);
    if (bailOutInfo_00->bailOutInstr != this->preOpBailOutInstrToProcess) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0xa32,"(bailOutInfo->bailOutInstr == preOpBailOutInstrToProcess)",
                         "bailOutInfo->bailOutInstr == preOpBailOutInstrToProcess");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    uVar1 = bailOutInfo_00->bailOutOffset;
    uVar5 = IR::Instr::GetByteCodeOffset(this->preOpBailOutInstrToProcess);
    if (uVar1 != uVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0xa33,
                         "(bailOutInfo->bailOutOffset == preOpBailOutInstrToProcess->GetByteCodeOffset())"
                         ,
                         "bailOutInfo->bailOutOffset == preOpBailOutInstrToProcess->GetByteCodeOffset()"
                        );
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    ProcessBailOutInfo(this,this->preOpBailOutInstrToProcess,bailOutInfo_00);
    this->preOpBailOutInstrToProcess = (Instr *)0x0;
    this_local = (BackwardPass *)currentInstr->m_prev;
  }
  return (Instr *)this_local;
}

Assistant:

IR::Instr*
BackwardPass::ProcessPendingPreOpBailOutInfo(IR::Instr *const currentInstr)
{
    Assert(!IsCollectionPass());

    if(!preOpBailOutInstrToProcess)
    {
        return currentInstr->m_prev;
    }
    Assert(preOpBailOutInstrToProcess == currentInstr);

    if (!this->IsPrePass())
    {
        IR::Instr* prev = preOpBailOutInstrToProcess->m_prev;
        while (prev && preOpBailOutInstrToProcess->CanAggregateByteCodeUsesAcrossInstr(prev))
        {
            IR::Instr* instr = prev;
            prev = prev->m_prev;
            if (instr->IsByteCodeUsesInstrFor(preOpBailOutInstrToProcess))
            {
                // If instr is a ByteCodeUsesInstr, it will remove it
                ProcessByteCodeUsesInstr(instr);
            }
        }
    }

    // A pre-op bailout instruction was saved for bailout info processing after the instruction and relevant ByteCodeUses
    // instructions before it have been processed. We can process the bailout info for that instruction now.
    BailOutInfo *const bailOutInfo = preOpBailOutInstrToProcess->GetBailOutInfo();
    Assert(bailOutInfo->bailOutInstr == preOpBailOutInstrToProcess);
    Assert(bailOutInfo->bailOutOffset == preOpBailOutInstrToProcess->GetByteCodeOffset());
    ProcessBailOutInfo(preOpBailOutInstrToProcess, bailOutInfo);
    preOpBailOutInstrToProcess = nullptr;

    // We might have removed the prev instr if it was a ByteCodeUsesInstr
    // Update the prevInstr on the main loop
    return currentInstr->m_prev;
}